

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDF::newIndirect(QPDF *this,QPDFObjGen og,shared_ptr<QPDFObject> *obj)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  long in_RCX;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  
  lVar2 = *(long *)in_RCX;
  *(QPDFObjGen *)(lVar2 + 0x48) = og;
  *(shared_ptr<QPDFObject> **)(lVar2 + 0x50) = obj;
  _Var4._M_head_impl = *(Members **)in_RCX;
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var4._M_head_impl;
  _Var3._M_head_impl = *(Members **)(in_RCX + 8);
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var3._M_head_impl != (Members *)0x0) {
    _Var4._M_head_impl = (Members *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1 = &((_Var3._M_head_impl)->log).
                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (QPDFObjectHandle)
             QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1 = &((_Var3._M_head_impl)->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    UNLOCK();
  }
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_head_impl;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::newIndirect(QPDFObjGen og, std::shared_ptr<QPDFObject> const& obj)
{
    obj->setDefaultDescription(this, og);
    return {obj};
}